

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int peekInternal(uint8_t distance)

{
  ulong nbChars;
  size_t sVar1;
  size_t nbReadChars;
  size_t nbExpectedChars;
  size_t writeIndex;
  size_t target;
  Expansion *exp;
  uint8_t distance_local;
  
  target = (size_t)lexerState->expansions;
  exp._3_1_ = distance;
  while( true ) {
    if (target == 0) {
      if (0x29 < exp._3_1_) {
        fatalerror("Internal lexer error: buffer has insufficient size for peeking (%u >= %u)\n",
                   (ulong)exp._3_1_,0x2a);
      }
      if ((lexerState->isMmapped & 1U) == 0) {
        if ((lexerState->field_2).field_1.nbChars <= (ulong)exp._3_1_) {
          writeIndex = 0x2a - (lexerState->field_2).field_1.nbChars;
          nbExpectedChars =
               ((lexerState->field_2).field_0.size + (lexerState->field_2).field_1.nbChars) % 0x2a;
          if (0x2a < nbExpectedChars + writeIndex) {
            nbChars = 0x2a - nbExpectedChars;
            sVar1 = readInternal(nbExpectedChars,nbChars);
            (lexerState->field_2).field_1.nbChars = sVar1 + (lexerState->field_2).field_1.nbChars;
            nbExpectedChars = sVar1 + nbExpectedChars;
            if (nbExpectedChars == 0x2a) {
              nbExpectedChars = 0;
            }
            writeIndex = writeIndex - sVar1;
            if (sVar1 < nbChars) {
              writeIndex = 0;
            }
          }
          if (writeIndex != 0) {
            sVar1 = readInternal(nbExpectedChars,writeIndex);
            (lexerState->field_2).field_1.nbChars = sVar1 + (lexerState->field_2).field_1.nbChars;
          }
          if ((lexerState->field_2).field_1.nbChars <= (ulong)exp._3_1_) {
            return -1;
          }
        }
        exp._4_4_ = (uint)*(byte *)((long)&lexerState->field_2 +
                                   ((lexerState->field_2).field_0.size + (ulong)exp._3_1_) % 0x2a +
                                   0x10);
      }
      else if ((lexerState->field_2).field_0.offset + (ulong)exp._3_1_ <
               (lexerState->field_2).field_0.size) {
        exp._4_4_ = (uint)(byte)(lexerState->field_2).field_0.ptr
                                [(lexerState->field_2).field_0.offset + (ulong)exp._3_1_];
      }
      else {
        exp._4_4_ = 0xffffffff;
      }
      return exp._4_4_;
    }
    if (*(ulong *)(target + 0x18) < *(ulong *)(target + 0x20)) {
      __assert_fail("exp->offset <= exp->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x330,"peekInternal");
    }
    if ((ulong)exp._3_1_ < (ulong)(*(long *)(target + 0x18) - *(long *)(target + 0x20))) break;
    exp._3_1_ = exp._3_1_ -
                ((char)*(undefined8 *)(target + 0x18) - (char)*(undefined8 *)(target + 0x20));
    target = *(size_t *)target;
  }
  return (int)*(char *)(*(long *)(target + 0x10) + *(long *)(target + 0x20) + (ulong)exp._3_1_);
}

Assistant:

static int peekInternal(uint8_t distance)
{
	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// An expansion that has reached its end will have `exp->offset` == `exp->size`,
		// and `peekInternal` will continue with its parent
		assert(exp->offset <= exp->size);
		if (distance < exp->size - exp->offset)
			return exp->contents.unowned[exp->offset + distance];
		distance -= exp->size - exp->offset;
	}

	if (distance >= LEXER_BUF_SIZE)
		fatalerror("Internal lexer error: buffer has insufficient size for peeking (%"
			   PRIu8 " >= %u)\n", distance, LEXER_BUF_SIZE);

	if (lexerState->isMmapped) {
		if (lexerState->offset + distance >= lexerState->size)
			return EOF;

		return (unsigned char)lexerState->ptr[lexerState->offset + distance];
	}

	if (lexerState->nbChars <= distance) {
		// Buffer isn't full enough, read some chars in
		size_t target = LEXER_BUF_SIZE - lexerState->nbChars; // Aim: making the buf full

		// Compute the index we'll start writing to
		size_t writeIndex = (lexerState->index + lexerState->nbChars) % LEXER_BUF_SIZE;

		// If the range to fill passes over the buffer wrapping point, we need two reads
		if (writeIndex + target > LEXER_BUF_SIZE) {
			size_t nbExpectedChars = LEXER_BUF_SIZE - writeIndex;
			size_t nbReadChars = readInternal(writeIndex, nbExpectedChars);

			lexerState->nbChars += nbReadChars;

			writeIndex += nbReadChars;
			if (writeIndex == LEXER_BUF_SIZE)
				writeIndex = 0;

			// If the read was incomplete, don't perform a second read
			target -= nbReadChars;
			if (nbReadChars < nbExpectedChars)
				target = 0;
		}
		if (target != 0)
			lexerState->nbChars += readInternal(writeIndex, target);

		// If there aren't enough chars even after refilling, give up
		if (lexerState->nbChars <= distance)
			return EOF;
	}

	return (unsigned char)lexerState->buf[(lexerState->index + distance) % LEXER_BUF_SIZE];
}